

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_serial_unix.cxx
# Opt level: O0

void ndiSerialClose(int serial_port)

{
  int local_10;
  int i;
  int serial_port_local;
  
  local_10 = 0;
  do {
    if (3 < local_10) {
LAB_0010fa39:
      fcntl(serial_port,6,&ndiSerialClose::fu);
      close(serial_port);
      return;
    }
    if ((ndi_open_handles[local_10] == serial_port) && (ndi_open_handles[local_10] != -1)) {
      tcsetattr(serial_port,0,(termios *)(ndi_save_termios + local_10));
      ndi_open_handles[local_10] = -1;
      goto LAB_0010fa39;
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

ndicapiExport void ndiSerialClose(int serial_port)
{
  static struct flock fu = { F_UNLCK, 0, 0, 0 }; /* for file unlocking */
  int i;

  /* restore the comm port state to from before it was opened */
  for (i = 0; i < NDI_MAX_SAVE_STATE; i++)
  {
    if (ndi_open_handles[i] == serial_port && ndi_open_handles[i] != -1)
    {
      tcsetattr(serial_port, TCSANOW, &ndi_save_termios[i]);
      ndi_open_handles[i] = -1;
      break;
    }
  }

  /* release our lock on the serial port */
  fcntl(serial_port, F_SETLK, &fu);

  close(serial_port);
}